

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O1

MPP_RET mpp_enc_cfg_get_ptr(MppEncCfg cfg,char *name,void **val)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  MppEncCfgService *pMVar3;
  MppTrieInfo *pMVar4;
  char *pcVar5;
  MppTrieInfo *pMVar6;
  MppCfgInfo *node;
  
  if (cfg == (MppEncCfg)0x0 || name == (char *)0x0) {
    _mpp_log_l(2,"mpp_enc_cfg","invalid input cfg %p name %p\n","mpp_enc_cfg_get_ptr",cfg,name);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    pMVar3 = MppEncCfgService::get();
    pMVar4 = mpp_trie_get_info(pMVar3->mTrie,name);
    if (pMVar4 == (MppTrieInfo *)0x0) {
      node = (MppCfgInfo *)0x0;
    }
    else {
      node = (MppCfgInfo *)(&pMVar4[1].field_0x0 + (byte)pMVar4->field_0x3);
    }
    MVar2 = check_cfg_info(node,name,CFG_FUNC_TYPE_Ptr,"mpp_enc_cfg_get_ptr");
    MVar1 = MPP_NOK;
    if (MVar2 == MPP_OK) {
      if (((byte)mpp_enc_cfg_debug & 4) != 0) {
        pMVar6 = pMVar4 + 1;
        if (pMVar4 == (MppTrieInfo *)0x0) {
          pMVar6 = (MppTrieInfo *)0x0;
        }
        pcVar5 = strof_cfg_type(node->data_type);
        _mpp_log_l(4,"mpp_enc_cfg","name %s type %s\n","mpp_enc_cfg_get_ptr",pMVar6,pcVar5);
      }
      MVar2 = mpp_cfg_get_ptr(node,(void *)((long)cfg + 8),val);
      return MVar2;
    }
  }
  return MVar1;
}

Assistant:

void mpp_enc_cfg_show(void)
{
    MppEncCfgService *srv = MppEncCfgService::get();
    MppTrieInfo *root = srv->get_info_first();

    mpp_log("dumping valid configure string start\n");

    if (root) {
        MppTrieInfo *node = root;

        do {
            if (node->ctx_len == sizeof(MppCfgInfo)) {
                MppCfgInfo *info = (MppCfgInfo *)mpp_trie_info_ctx(node);

                mpp_log("%-25s type %s - %d:%d\n", mpp_trie_info_name(node),
                        strof_cfg_type(info->data_type), info->data_offset, info->data_size);
            } else {
                mpp_log("%-25s size - %d\n", mpp_trie_info_name(node), node->ctx_len);
            }

            node = srv->get_info_next(node);
            if (!node)
                break;
        } while (1);
    }
    mpp_log("dumping valid configure string done\n");

    mpp_log("total cfg count %d with %d node size %d\n",
            srv->get_info_count(), srv->get_node_count(), srv->get_info_size());
}